

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O0

int format_header_v7tar(archive_write *a,char *h,archive_entry *entry,int strict,
                       archive_string_conv *sconv)

{
  char *pcVar1;
  char *pcVar2;
  mode_t mVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  la_int64_t lVar7;
  time_t v;
  int local_64;
  char *pcStack_60;
  int mytartype;
  char *pp;
  char *p;
  size_t copy_length;
  int ret;
  int r;
  int i;
  uint checksum;
  archive_string_conv *sconv_local;
  archive_entry *paStack_28;
  int strict_local;
  archive_entry *entry_local;
  char *h_local;
  archive_write *a_local;
  
  copy_length._0_4_ = 0;
  local_64 = -1;
  _i = sconv;
  sconv_local._4_4_ = strict;
  paStack_28 = entry;
  entry_local = (archive_entry *)h;
  h_local = (char *)a;
  memcpy(h,"",0x200);
  copy_length._4_4_ = _archive_entry_pathname_l(paStack_28,&stack0xffffffffffffffa0,(size_t *)&p,_i)
  ;
  if (copy_length._4_4_ != L'\0') {
    piVar5 = __errno_location();
    pcVar2 = h_local;
    pcVar1 = pcStack_60;
    if (*piVar5 == 0xc) {
      archive_set_error((archive *)h_local,0xc,"Can\'t allocate memory for Pathname");
      return -0x1e;
    }
    pcVar6 = archive_string_conversion_charset_name(_i);
    archive_set_error((archive *)pcVar2,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar1,pcVar6)
    ;
    copy_length._0_4_ = -0x14;
  }
  if ((sconv_local._4_4_ == 0) || ((char *)0x63 < p)) {
    if ((sconv_local._4_4_ == 0) && (p < (char *)0x65)) {
      memcpy(entry_local,pcStack_60,(size_t)p);
    }
    else {
      archive_set_error((archive *)h_local,0x24,"Pathname too long");
      copy_length._0_4_ = -0x19;
    }
  }
  else {
    memcpy(entry_local,pcStack_60,(size_t)p);
  }
  copy_length._4_4_ = _archive_entry_hardlink_l(paStack_28,&pp,(size_t *)&p,_i);
  if (copy_length._4_4_ != L'\0') {
    piVar5 = __errno_location();
    pcVar2 = h_local;
    pcVar1 = pp;
    if (*piVar5 == 0xc) {
      archive_set_error((archive *)h_local,0xc,"Can\'t allocate memory for Linkname");
      return -0x1e;
    }
    pcVar6 = archive_string_conversion_charset_name(_i);
    archive_set_error((archive *)pcVar2,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar1,pcVar6)
    ;
    copy_length._0_4_ = -0x14;
  }
  if (p == (char *)0x0) {
    copy_length._4_4_ = _archive_entry_symlink_l(paStack_28,&pp,(size_t *)&p,_i);
    if (copy_length._4_4_ != L'\0') {
      piVar5 = __errno_location();
      pcVar2 = h_local;
      pcVar1 = pp;
      if (*piVar5 == 0xc) {
        archive_set_error((archive *)h_local,0xc,"Can\'t allocate memory for Linkname");
        return -0x1e;
      }
      pcVar6 = archive_string_conversion_charset_name(_i);
      archive_set_error((archive *)pcVar2,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar1,
                        pcVar6);
      copy_length._0_4_ = -0x14;
    }
  }
  else {
    local_64 = 0x31;
  }
  if (p != (char *)0x0) {
    if ((char *)0x63 < p) {
      archive_set_error((archive *)h_local,0x24,"Link contents too long");
      copy_length._0_4_ = -0x19;
      p = (char *)0x64;
    }
    memcpy((void *)((long)&(entry_local->ae_stat).aest_devminor + 5),pp,(size_t)p);
  }
  mVar3 = archive_entry_mode(paStack_28);
  iVar4 = format_number((ulong)(mVar3 & 0xfff),(char *)((long)&(entry_local->ae_stat).aest_ino + 4),
                        6,8,sconv_local._4_4_);
  if (iVar4 != 0) {
    archive_set_error((archive *)h_local,0x22,"Numeric mode too large");
    copy_length._0_4_ = -0x19;
  }
  lVar7 = archive_entry_uid(paStack_28);
  iVar4 = format_number(lVar7,&(entry_local->ae_stat).field_0x54,6,8,sconv_local._4_4_);
  if (iVar4 != 0) {
    archive_set_error((archive *)h_local,0x22,"Numeric user ID too large");
    copy_length._0_4_ = -0x19;
  }
  lVar7 = archive_entry_gid(paStack_28);
  iVar4 = format_number(lVar7,(char *)((long)&(entry_local->ae_stat).aest_size + 4),6,8,
                        sconv_local._4_4_);
  if (iVar4 != 0) {
    archive_set_error((archive *)h_local,0x22,"Numeric group ID too large");
    copy_length._0_4_ = -0x19;
  }
  lVar7 = archive_entry_size(paStack_28);
  iVar4 = format_number(lVar7,(char *)((long)&(entry_local->ae_stat).aest_uid + 4),0xb,0xc,
                        sconv_local._4_4_);
  if (iVar4 != 0) {
    archive_set_error((archive *)h_local,0x22,"File size out of range");
    copy_length._0_4_ = -0x19;
  }
  v = archive_entry_mtime(paStack_28);
  iVar4 = format_number(v,(char *)&(entry_local->ae_stat).aest_dev,0xb,0xc,sconv_local._4_4_);
  if (iVar4 != 0) {
    archive_set_error((archive *)h_local,0x22,"File modification time too large");
    copy_length._0_4_ = -0x19;
  }
  if (local_64 < 0) {
    mVar3 = archive_entry_filetype(paStack_28);
    pcVar1 = h_local;
    if (mVar3 == 0x1000) {
      archive_set_error((archive *)h_local,0x54,"tar format cannot archive fifo");
      return -0x19;
    }
    if (mVar3 == 0x2000) {
      archive_set_error((archive *)h_local,0x54,"tar format cannot archive character device");
      return -0x19;
    }
    if (mVar3 != 0x4000) {
      if (mVar3 == 0x6000) {
        archive_set_error((archive *)h_local,0x54,"tar format cannot archive block device");
        return -0x19;
      }
      if (mVar3 != 0x8000) {
        if (mVar3 == 0xa000) {
          *(undefined1 *)((long)&(entry_local->ae_stat).aest_devminor + 4) = 0x32;
        }
        else {
          if (mVar3 == 0xc000) {
            archive_set_error((archive *)h_local,0x54,"tar format cannot archive socket");
            return -0x19;
          }
          mVar3 = archive_entry_mode(paStack_28);
          archive_set_error((archive *)pcVar1,0x54,"tar format cannot archive this (mode=0%lo)",
                            (ulong)mVar3);
          copy_length._0_4_ = -0x19;
        }
      }
    }
  }
  else {
    *(char *)((long)&(entry_local->ae_stat).aest_devminor + 4) = (char)local_64;
  }
  r = 0;
  for (ret = 0; ret < 0x200; ret = ret + 1) {
    r = (uint)*(byte *)((long)&entry_local->archive + (long)ret) + r;
  }
  format_octal((ulong)(uint)r,(char *)((long)&(entry_local->ae_stat).aest_devmajor + 4),6);
  *(undefined1 *)((long)&(entry_local->ae_stat).aest_devminor + 2) = 0;
  return (int)copy_length;
}

Assistant:

static int
format_header_v7tar(struct archive_write *a, char h[512],
    struct archive_entry *entry, int strict,
    struct archive_string_conv *sconv)
{
	unsigned int checksum;
	int i, r, ret;
	size_t copy_length;
	const char *p, *pp;
	int mytartype;

	ret = 0;
	mytartype = -1;
	/*
	 * The "template header" already includes the "v7tar"
	 * signature, various end-of-field markers and other required
	 * elements.
	 */
	memcpy(h, &template_header, 512);

	/*
	 * Because the block is already null-filled, and strings
	 * are allowed to exactly fill their destination (without null),
	 * I use memcpy(dest, src, strlen()) here a lot to copy strings.
	 */
	r = archive_entry_pathname_l(entry, &pp, &copy_length, sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    pp, archive_string_conversion_charset_name(sconv));
		ret = ARCHIVE_WARN;
	}
	if (strict && copy_length < V7TAR_name_size)
		memcpy(h + V7TAR_name_offset, pp, copy_length);
	else if (!strict && copy_length <= V7TAR_name_size)
		memcpy(h + V7TAR_name_offset, pp, copy_length);
	else {
		/* Prefix is too long. */
		archive_set_error(&a->archive, ENAMETOOLONG,
		    "Pathname too long");
		ret = ARCHIVE_FAILED;
	}

	r = archive_entry_hardlink_l(entry, &p, &copy_length, sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    p, archive_string_conversion_charset_name(sconv));
		ret = ARCHIVE_WARN;
	}
	if (copy_length > 0)
		mytartype = '1';
	else {
		r = archive_entry_symlink_l(entry, &p, &copy_length, sconv);
		if (r != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate linkname '%s' to %s",
			    p, archive_string_conversion_charset_name(sconv));
			ret = ARCHIVE_WARN;
		}
	}
	if (copy_length > 0) {
		if (copy_length >= V7TAR_linkname_size) {
			archive_set_error(&a->archive, ENAMETOOLONG,
			    "Link contents too long");
			ret = ARCHIVE_FAILED;
			copy_length = V7TAR_linkname_size;
		}
		memcpy(h + V7TAR_linkname_offset, p, copy_length);
	}

	if (format_number(archive_entry_mode(entry) & 07777,
	    h + V7TAR_mode_offset, V7TAR_mode_size,
	    V7TAR_mode_max_size, strict)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric mode too large");
		ret = ARCHIVE_FAILED;
	}

	if (format_number(archive_entry_uid(entry),
	    h + V7TAR_uid_offset, V7TAR_uid_size, V7TAR_uid_max_size, strict)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID too large");
		ret = ARCHIVE_FAILED;
	}

	if (format_number(archive_entry_gid(entry),
	    h + V7TAR_gid_offset, V7TAR_gid_size, V7TAR_gid_max_size, strict)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID too large");
		ret = ARCHIVE_FAILED;
	}

	if (format_number(archive_entry_size(entry),
	    h + V7TAR_size_offset, V7TAR_size_size,
	    V7TAR_size_max_size, strict)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		ret = ARCHIVE_FAILED;
	}

	if (format_number(archive_entry_mtime(entry),
	    h + V7TAR_mtime_offset, V7TAR_mtime_size,
	    V7TAR_mtime_max_size, strict)) {
		archive_set_error(&a->archive, ERANGE,
		    "File modification time too large");
		ret = ARCHIVE_FAILED;
	}

	if (mytartype >= 0) {
		h[V7TAR_typeflag_offset] = mytartype;
	} else {
		switch (archive_entry_filetype(entry)) {
		case AE_IFREG: case AE_IFDIR:
			break;
		case AE_IFLNK:
			h[V7TAR_typeflag_offset] = '2';
			break;
		case AE_IFCHR:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "tar format cannot archive character device");
			return (ARCHIVE_FAILED);
		case AE_IFBLK:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "tar format cannot archive block device");
			return (ARCHIVE_FAILED);
		case AE_IFIFO:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "tar format cannot archive fifo");
			return (ARCHIVE_FAILED);
		case AE_IFSOCK:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "tar format cannot archive socket");
			return (ARCHIVE_FAILED);
		default:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "tar format cannot archive this (mode=0%lo)",
			    (unsigned long)archive_entry_mode(entry));
			ret = ARCHIVE_FAILED;
		}
	}

	checksum = 0;
	for (i = 0; i < 512; i++)
		checksum += 255 & (unsigned int)h[i];
	format_octal(checksum, h + V7TAR_checksum_offset, 6);
	/* Can't be pre-set in the template. */
	h[V7TAR_checksum_offset + 6] = '\0';
	return (ret);
}